

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

uint __thiscall crnlib::dxt_image::get_selector(dxt_image *this,uint x,uint y,uint element_index)

{
  uint uVar1;
  etc1_block *this_00;
  
  if (this->m_element_type[element_index] - cColorDXT1 < 4) {
    this_00 = (etc1_block *)
              (this->m_pElements +
              (((y >> 2) * this->m_blocks_x + (x >> 2)) * this->m_num_elements_per_block +
              element_index));
    switch(this->m_element_type[element_index]) {
    case cColorDXT1:
      return this_00->m_low_color[(ulong)(y & 3) - 4] >> ((char)x * '\x02' & 6U) & 3;
    case cAlphaDXT3:
      uVar1 = dxt3_block::get_alpha((dxt3_block *)this_00,x & 3,y & 3,false);
      return uVar1;
    case cAlphaDXT5:
      uVar1 = dxt5_block::get_selector((dxt5_block *)this_00,x & 3,y & 3);
      return uVar1;
    case cColorETC1:
      uVar1 = etc1_block::get_selector(this_00,x & 3,y & 3);
      return uVar1;
    }
  }
  return 0;
}

Assistant:

uint dxt_image::get_selector(uint x, uint y, uint element_index) const {
  CRNLIB_ASSERT((x < m_width) && (y < m_height));

  const uint block_x = x >> cDXTBlockShift;
  const uint block_y = y >> cDXTBlockShift;

  const element& block = get_element(block_x, block_y, element_index);

  switch (m_element_type[element_index]) {
    case cColorETC1: {
      const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&block);
      return src_block.get_selector(x & 3, y & 3);
    }
    case cColorDXT1: {
      const dxt1_block& block1 = *reinterpret_cast<const dxt1_block*>(&block);
      return block1.get_selector(x & 3, y & 3);
    }
    case cAlphaDXT5: {
      const dxt5_block& block5 = *reinterpret_cast<const dxt5_block*>(&block);
      return block5.get_selector(x & 3, y & 3);
    }
    case cAlphaDXT3: {
      const dxt3_block& block3 = *reinterpret_cast<const dxt3_block*>(&block);
      return block3.get_alpha(x & 3, y & 3, false);
    }
    default:
      break;
  }

  return 0;
}